

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack29_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [32];
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar13 [64];
  
  auVar1 = *(undefined1 (*) [32])(in + 1);
  auVar8 = vpmovsxbd_avx512f(_DAT_0018ac70);
  uVar2 = *in;
  auVar5 = *(undefined1 (*) [16])(in + 9);
  auVar9 = vpmovsxbd_avx512f(_DAT_00197990);
  auVar10 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar3 = vpsllvd_avx2(auVar1,_DAT_00193d80);
  auVar7 = vpsllvd_avx2(auVar5,_DAT_001978b0);
  auVar3 = vpand_avx2(auVar3,_DAT_00194440);
  auVar7 = vpand_avx(auVar7,_DAT_001978c0);
  *out = uVar2 & 0x1fffffff;
  auVar8 = vpermi2d_avx512f(auVar8,ZEXT3264(auVar1),ZEXT464(uVar2));
  auVar11 = vpmovsxbd_avx512f(_DAT_00197980);
  auVar8 = vpermi2d_avx512f(auVar11,auVar8,ZEXT1664(auVar5));
  auVar11 = vpbroadcastd_avx512f(ZEXT416(0x1fffffff));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(in + 0xe);
  auVar5 = vpsllvd_avx2(auVar15,_DAT_001978d0);
  auVar6._8_8_ = 0x1fff00001fffe000;
  auVar6._0_8_ = 0x1fff00001fffe000;
  auVar5 = vpandq_avx512vl(auVar5,auVar6);
  auVar12 = vpbroadcastd_avx512f();
  auVar13._0_56_ = auVar8._0_56_;
  auVar13._56_4_ = auVar12._56_4_;
  auVar13._60_4_ = auVar8._60_4_;
  auVar8 = vpermi2d_avx512f(auVar9,auVar13,ZEXT864(*(ulong *)(in + 0xe)));
  auVar8 = vpsrlvd_avx512f(auVar8,_DAT_001a72c0);
  auVar9 = vpmovsxbd_avx512f(_DAT_001979a0);
  auVar12 = vmovdqa32_avx512f(auVar11);
  auVar12 = ZEXT4064(CONCAT436(auVar12._36_4_,CONCAT432(0,auVar3)));
  auVar9 = vpermi2d_avx512f(auVar9,auVar12,ZEXT1664(auVar7));
  auVar13 = vpbroadcastd_avx512f();
  auVar14._0_52_ = auVar9._0_52_;
  auVar14._52_4_ = auVar13._52_4_;
  auVar14._56_4_ = auVar9._56_4_;
  auVar14._60_4_ = auVar9._60_4_;
  auVar9 = vpermi2q_avx512f(auVar10,auVar14,ZEXT1664(auVar5));
  uVar2 = in[0x13];
  auVar9 = vpord_avx512f(auVar8,auVar9);
  auVar8 = vpandd_avx512f(auVar8,auVar12);
  auVar10._0_36_ = auVar9._0_36_;
  auVar10._36_4_ = auVar8._36_4_;
  auVar10._40_4_ = auVar9._40_4_;
  auVar10._44_4_ = auVar9._44_4_;
  auVar10._48_4_ = auVar9._48_4_;
  auVar10._52_4_ = auVar9._52_4_;
  auVar10._56_4_ = auVar9._56_4_;
  auVar10._60_4_ = auVar9._60_4_;
  auVar5 = *(undefined1 (*) [16])(in + 0x10);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x2010005));
  auVar8 = vmovdqu64_avx512f(auVar10);
  *(undefined1 (*) [64])(out + 1) = auVar8;
  auVar6 = vpermi2d_avx512vl(auVar7,auVar5,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(in + 0x14);
  auVar7 = vpalignr_avx(auVar16,auVar5,0xc);
  auVar6 = vpshldvd_avx512_vbmi2(auVar5,auVar6,_DAT_001978f0);
  auVar7 = vpsrlvd_avx2(auVar7,_DAT_001a4630);
  auVar5 = vpsllvd_avx2(auVar16,_DAT_00197e40);
  auVar4._8_8_ = 0x1fffffe01ffffffc;
  auVar4._0_8_ = 0x1fffffe01ffffffc;
  auVar7 = vpternlogq_avx512vl(auVar5,auVar7,auVar4,0xec);
  auVar5 = vpand_avx(auVar6,auVar11._0_16_);
  *(undefined1 (*) [16])(out + 0x11) = auVar5;
  out[0x15] = uVar2 >> 1 & 0x1fffffff;
  *(long *)(out + 0x16) = auVar7._0_8_;
  return in + 0x16;
}

Assistant:

const uint32_t *__fastunpack29_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 5)) << (29 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  *out |= ((*in) % (1U << 2)) << (29 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 29);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 28)) << (29 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 25)) << (29 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 22)) << (29 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 19)) << (29 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 16)) << (29 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 13)) << (29 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 10)) << (29 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 7)) << (29 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 4)) << (29 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 1)) << (29 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 29);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 27)) << (29 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 24)) << (29 - 24);
  out++;

  return in + 1;
}